

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::check_collapse_class
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  LO size_in;
  void *extraout_RDX;
  Int ent_dim;
  Read<signed_char> RVar1;
  Write<signed_char> local_188;
  undefined1 local_178 [8];
  type f;
  string local_110 [32];
  undefined1 local_f0 [8];
  Write<signed_char> cand_codes_w;
  LOs edge_verts2verts;
  string local_c8 [32];
  undefined1 local_a8 [8];
  Read<signed_char> edges2class_dim;
  string local_80 [32];
  undefined1 local_60 [8];
  Read<signed_char> verts2class_dim;
  LO ncands;
  Read<signed_char> *cand_codes_local;
  LOs *cands2edges_local;
  Mesh *mesh_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  if (((ulong)(cands2edges->write_).shared_alloc_.alloc & 1) == 0) {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((cands2edges->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((ulong)(cands2edges->write_).shared_alloc_.alloc >> 3);
  }
  verts2class_dim.write_.shared_alloc_.direct_ptr._4_4_ = (LO)((ulong)local_10._M_pi >> 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"class_dim",(allocator *)&stack0xffffffffffffff7f);
  ent_dim = (Int)mesh;
  Mesh::get_array<signed_char>((Mesh *)local_60,ent_dim,(string *)0x0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c8,"class_dim",
             (allocator *)((long)&edge_verts2verts.write_.shared_alloc_.direct_ptr + 7));
  Mesh::get_array<signed_char>((Mesh *)local_a8,ent_dim,(string *)0x1);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&edge_verts2verts.write_.shared_alloc_.direct_ptr + 7));
  Mesh::ask_verts_of((Mesh *)&cand_codes_w.shared_alloc_.direct_ptr,ent_dim);
  size_in = verts2class_dim.write_.shared_alloc_.direct_ptr._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,"",(allocator *)((long)&f.cand_codes_w.shared_alloc_.direct_ptr + 7));
  Write<signed_char>::Write((Write<signed_char> *)local_f0,size_in,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.cand_codes_w.shared_alloc_.direct_ptr + 7));
  Read<signed_char>::Read((Read<signed_char> *)local_178,cand_codes);
  Read<int>::Read((Read<int> *)&f.cand_codes.write_.shared_alloc_.direct_ptr,cands2edges);
  Read<int>::Read((Read<int> *)&f.cands2edges.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&cand_codes_w.shared_alloc_.direct_ptr);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.edge_verts2verts.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_60);
  Read<signed_char>::Read
            ((Read<signed_char> *)&f.verts2class_dim.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_a8);
  Write<signed_char>::Write
            ((Write<signed_char> *)&f.edges2class_dim.write_.shared_alloc_.direct_ptr,
             (Write<signed_char> *)local_f0);
  parallel_for<Omega_h::check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::__0>
            (verts2class_dim.write_.shared_alloc_.direct_ptr._4_4_,(type *)local_178,
             "check_collapse_class");
  Write<signed_char>::Write(&local_188,(Write<signed_char> *)local_f0);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_188);
  Write<signed_char>::~Write(&local_188);
  check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)local_178);
  Write<signed_char>::~Write((Write<signed_char> *)local_f0);
  Read<int>::~Read((Read<int> *)&cand_codes_w.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)local_a8);
  Read<signed_char>::~Read((Read<signed_char> *)local_60);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> check_collapse_class(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  auto ncands = cands2edges.size();
  auto verts2class_dim = mesh->get_array<I8>(VERT, "class_dim");
  auto edges2class_dim = mesh->get_array<I8>(EDGE, "class_dim");
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto cand_codes_w = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = cand_codes[cand];
    auto edge = cands2edges[cand];
    LO eev2v[2];
    for (Int eev = 0; eev < 2; ++eev)
      eev2v[eev] = edge_verts2verts[edge * 2 + eev];
    Int eev_cd[2];
    for (Int eev = 0; eev < 2; ++eev) eev_cd[eev] = verts2class_dim[eev2v[eev]];
    Int e_cd = edges2class_dim[edge];
    /* if both vertices are classified onto the same dimension,
       the edge must also be classified onto that dimension */
    if (eev_cd[0] == eev_cd[1]) {
      if (eev_cd[0] != e_cd) code = DONT_COLLAPSE;
    } else {
      for (Int col_v = 0; col_v < 2; ++col_v) {
        if (collapses(cand_codes[cand], col_v)) {
          /* otherwise, the vertex to collapse and the edge must
             be classified onto the same dimension */
          if (eev_cd[col_v] != e_cd) {
            code = dont_collapse(code, col_v);
          }
        }
      }
    }
    cand_codes_w[cand] = code;
  };
  parallel_for(ncands, f, "check_collapse_class");
  return cand_codes_w;
}